

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::FindOneOf(ON_wString *this,wchar_t *character_set)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int rc;
  int buffer_count;
  int s_count;
  ON__UINT32 sUTF32 [2];
  int buffer_capacity;
  wchar_t buffer [10];
  wchar_t *s;
  uint local_30;
  ON_UnicodeErrorParameters e;
  wchar_t *s1;
  wchar_t *character_set_local;
  ON_wString *this_local;
  
  if (((character_set != (wchar_t *)0x0) && (*character_set != L'\0')) &&
     (bVar1 = IsEmpty(this), e._4_8_ = character_set, !bVar1)) {
    for (; *(int *)e._4_8_ != 0; e._4_8_ = e._4_8_ + 4) {
    }
    memset((void *)((long)&s + 4),0,0xc);
    local_30 = 0xe;
    memset(sUTF32 + 1,0,0x28);
    sUTF32[0] = 9;
    memset(&buffer_count,0,8);
    for (buffer._32_8_ = character_set; (ulong)buffer._32_8_ < (ulong)e._4_8_;
        buffer._32_8_ = buffer._32_8_ + (long)iVar2 * 4) {
      s._4_4_ = 0;
      iVar2 = ON_DecodeWideChar((wchar_t *)buffer._32_8_,(int)((long)(e._4_8_ - buffer._32_8_) >> 2)
                                ,(ON_UnicodeErrorParameters *)((long)&s + 4),
                                (ON__UINT32 *)&buffer_count);
      if (iVar2 < 1) {
        return -1;
      }
      if (buffer_count == 0) {
        return -1;
      }
      if (s_count != 0) {
        return -1;
      }
      s._4_4_ = 0;
      iVar3 = ON_ConvertUTF32ToWideChar
                        (0,(ON__UINT32 *)&buffer_count,1,(wchar_t *)(sUTF32 + 1),9,
                         (uint *)((long)&s + 4),local_30,e.m_error_status,(ON__UINT32 **)0x0);
      if (((s._4_4_ == 0) && (0 < iVar3)) && (iVar3 < 9)) {
        sUTF32[(long)iVar3 + 1] = 0;
        iVar3 = Find(this,(wchar_t *)(sUTF32 + 1));
        if (-1 < iVar3) {
          return iVar3;
        }
      }
    }
  }
  return -1;
}

Assistant:

int ON_wString::FindOneOf (const wchar_t* character_set) const
{
  if ( nullptr == character_set || 0 == character_set[0] || IsEmpty() )
    return -1;

  const wchar_t* s1 = character_set;
  while ( 0 != *s1 )
    s1++;

  ON_UnicodeErrorParameters e = { 0 };
  e.m_error_mask = 2 | 4 | 8;

  const wchar_t* s = character_set;
  wchar_t buffer[10] = { 0 };
  const int buffer_capacity = sizeof(buffer) / sizeof(buffer[0]) - 1;
  ON__UINT32 sUTF32[2] = { 0 };
  while (s < s1)
  {
    e.m_error_status = 0;
    int s_count = ON_DecodeWideChar(s, (int)(s1 - s), &e, &sUTF32[0]);
    if (s_count <= 0 || 0 == sUTF32[0] || 0 != sUTF32[1])
      break;
    e.m_error_status = 0;
    int buffer_count = ON_ConvertUTF32ToWideChar(
      false,
      sUTF32, 1,
      buffer, buffer_capacity,
      &e.m_error_status,
      e.m_error_mask,
      e.m_error_code_point,
      nullptr);
    if (0 == e.m_error_status && buffer_count > 0 && buffer_count < buffer_capacity)
    {
      buffer[buffer_count] = 0;
      int rc = Find(buffer);
      if (rc >= 0)
        return rc;
    }
    s += s_count;
  }
  return -1;
}